

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::EndStep(SscWriterGeneric *this,bool writerLocked)

{
  byte in_SIL;
  thread *in_RDI;
  SscWriterGeneric *in_stack_ffffffffffffffb0;
  thread *this_00;
  SscWriterGeneric **in_stack_ffffffffffffffe0;
  type *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  *(byte *)&in_RDI[0x2b]._M_id._M_thread = in_SIL & 1;
  if (in_RDI[10]._M_id._M_thread == 0) {
    if ((in_RDI[0x10]._M_id._M_thread & 1) == 0) {
      EndStepFirst(in_stack_ffffffffffffffb0);
    }
    else {
      std::thread::
      thread<void(adios2::core::engine::ssc::SscWriterGeneric::*)(),adios2::core::engine::ssc::SscWriterGeneric*,void>
                ((thread *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),
                 in_stack_ffffffffffffffe8,(SscWriterGeneric **)0x0);
      std::thread::operator=((thread *)in_stack_ffffffffffffffb0,in_RDI);
      std::thread::~thread((thread *)0x1d182d);
    }
  }
  else if (((in_RDI[0x2b]._M_id._M_thread & 1) == 0) ||
          ((in_RDI[0x2b]._M_id._M_thread & 0x100) == 0)) {
    if ((in_RDI[0x10]._M_id._M_thread & 1) == 0) {
      EndStepConsequentFlexible(in_stack_ffffffffffffffb0);
    }
    else {
      this_00 = in_RDI;
      std::thread::
      thread<void(adios2::core::engine::ssc::SscWriterGeneric::*)(),adios2::core::engine::ssc::SscWriterGeneric*,void>
                ((thread *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),
                 in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      std::thread::operator=(this_00,in_RDI);
      std::thread::~thread((thread *)0x1d18c0);
    }
  }
  else {
    EndStepConsequentFixed
              ((SscWriterGeneric *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff))
    ;
  }
  return;
}

Assistant:

void SscWriterGeneric::EndStep(const bool writerLocked)
{

    m_WriterDefinitionsLocked = writerLocked;

    if (m_CurrentStep == 0)
    {
        if (m_Threading)
        {
            m_EndStepThread = std::thread(&SscWriterGeneric::EndStepFirst, this);
        }
        else
        {
            EndStepFirst();
        }
    }
    else
    {
        if (m_WriterDefinitionsLocked && m_ReaderSelectionsLocked)
        {
            EndStepConsequentFixed();
        }
        else
        {
            if (m_Threading)
            {
                m_EndStepThread = std::thread(&SscWriterGeneric::EndStepConsequentFlexible, this);
            }
            else
            {
                EndStepConsequentFlexible();
            }
        }
    }
}